

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O0

ssize_t __thiscall FileWriter::write(FileWriter *this,int __fd,void *__buf,size_t __n)

{
  undefined1 uVar1;
  ostream *poVar2;
  _InputArray *this_00;
  ssize_t sVar3;
  undefined4 in_register_00000034;
  string *in_stack_00000020;
  FileWriter *in_stack_00000028;
  string path;
  Mat *in_stack_ffffffffffffff48;
  vector *pvVar4;
  Timer *t;
  undefined7 in_stack_ffffffffffffff70;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  string *in_stack_ffffffffffffff90;
  FileWriter *in_stack_ffffffffffffff98;
  Timer local_40 [4];
  size_t local_20;
  void *local_18;
  undefined8 local_10;
  FileWriter *local_8;
  
  local_10 = CONCAT44(in_register_00000034,__fd);
  t = local_40;
  local_20 = __n;
  local_18 = __buf;
  local_8 = this;
  buildPath(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  uVar1 = tryWrite(in_stack_00000028,in_stack_00000020);
  if ((bool)uVar1) {
    this_00 = (_InputArray *)std::operator<<((ostream *)&std::cout,"Writing: ");
    std::operator<<((ostream *)this_00,(string *)local_40);
    cv::_InputArray::_InputArray(this_00,in_stack_ffffffffffffff48);
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    pvVar4 = (vector *)&local_88;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x261c77);
    cv::imwrite((string *)local_40,(_InputArray *)&stack0xffffffffffffff98,pvVar4);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    cv::_InputArray::~_InputArray((_InputArray *)&stack0xffffffffffffff98);
    logTime((FileWriter *)CONCAT17(uVar1,in_stack_ffffffffffffff70),t);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Skipping (file exists): ");
    std::operator<<(poVar2,(string *)local_40);
    logTime((FileWriter *)CONCAT17(uVar1,in_stack_ffffffffffffff70),t);
  }
  sVar3 = std::__cxx11::string::~string((string *)local_40);
  return sVar3;
}

Assistant:

void FileWriter::write(
  const std::string& tail,
  const cv::Mat& mat,
  const Timer* t) {
  auto path = buildPath(tail);
  if (!tryWrite(path)) {
    std::cout << "Skipping (file exists): " << path;
    logTime(t);
    return;
  }

  std::cout << "Writing: " << path;
  cv::imwrite(path, mat);
  logTime(t);
}